

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

Result __thiscall
wabt::TypeChecker::OnReturnCallIndirect
          (TypeChecker *this,TypeVector *param_types,TypeVector *result_types)

{
  Result RVar1;
  Result RVar2;
  Result RVar3;
  Result RVar4;
  Enum EVar5;
  char *in_RCX;
  Label *func_label;
  
  RVar1 = PopAndCheck1Type(this,(Type)0xffffffffffffffff,"return_call_indirect");
  RVar2 = PopAndCheckSignature(this,param_types,"return_call_indirect");
  RVar3 = GetThisFunctionLabel(this,&func_label);
  if (RVar3.enum_ == Error) {
    EVar5 = Error;
  }
  else {
    RVar3 = CheckReturnSignature(this,result_types,&func_label->result_types,in_RCX);
    RVar4 = SetUnreachable(this);
    EVar5 = (Enum)(((RVar4.enum_ == Error || RVar1.enum_ == Error) || RVar2.enum_ == Error) ||
                  RVar3.enum_ == Error);
  }
  return (Result)EVar5;
}

Assistant:

Result TypeChecker::OnReturnCallIndirect(const TypeVector& param_types,
                                         const TypeVector& result_types) {
  Result result = PopAndCheck1Type(Type::I32, "return_call_indirect");

  result |= PopAndCheckSignature(param_types, "return_call_indirect");
  Label* func_label;
  CHECK_RESULT(GetThisFunctionLabel(&func_label));
  result |= CheckReturnSignature(result_types, func_label->result_types,
                                 "return_call_indirect");

  CHECK_RESULT(SetUnreachable());
  return result;
}